

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_encoder.hpp
# Opt level: O3

void __thiscall
jsoncons::basic_compact_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::
write_bigint_value(basic_compact_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>
                   *this,string_view_type *sv)

{
  bignum_format_kind bVar1;
  bool bVar2;
  stream_sink<char> *psVar3;
  vector<unsigned_char,_std::allocator<unsigned_char>_> v;
  bigint n;
  int signum;
  basic_bigint<std::allocator<unsigned_char>_> v_3;
  basic_bigint<std::allocator<unsigned_char>_> v_1;
  basic_bigint<std::allocator<unsigned_char>_> local_c8;
  basic_bigint<std::allocator<unsigned_char>_> local_98;
  int local_6c;
  basic_bigint<std::allocator<unsigned_char>_> local_68;
  basic_bigint<std::allocator<unsigned_char>_> local_40;
  
  bVar1 = (this->options_).bignum_format_;
  if (bVar1 == base64url) {
    basic_bigint<std::allocator<unsigned_char>_>::from_string<char>(&local_98,sv->_M_str,sv->_M_len)
    ;
    bVar2 = operator<(&local_98,0);
    if (bVar2) {
      basic_bigint<std::allocator<unsigned_char>_>::basic_bigint(&local_68,&local_98);
      local_68.field_0._0_1_ = local_68.field_0._0_1_ ^ 2;
      jsoncons::operator-(&local_c8,&local_68,1);
      basic_bigint<std::allocator<unsigned_char>_>::operator=(&local_98,&local_c8);
      if (((local_c8.field_0._0_8_ & 1) != 0) &&
         ((pointer)local_c8.field_0.short_stor_.values_[1] != (pointer)0x0)) {
        operator_delete(local_c8.field_0.dynamic_stor_.data_,
                        local_c8.field_0.short_stor_.values_[0] << 3);
      }
      if (((local_68.field_0._0_1_ & 1) != 0) &&
         ((pointer)local_68.field_0.short_stor_.values_[1] != (pointer)0x0)) {
        operator_delete(local_68.field_0.dynamic_stor_.data_,
                        local_68.field_0.short_stor_.values_[0] << 3);
      }
    }
    local_c8._0_8_ = (uchar *)0x0;
    local_c8.field_0._0_8_ = (uchar *)0x0;
    local_c8.field_0.common_stor_.length_ = 0;
    basic_bigint<std::allocator<unsigned_char>>::write_bytes_be<std::allocator<unsigned_char>>
              ((basic_bigint<std::allocator<unsigned_char>> *)&local_98,&local_6c,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_c8);
    psVar3 = &this->sink_;
    stream_sink<char>::push_back(psVar3,'\"');
    if (bVar2) {
      stream_sink<char>::push_back(psVar3,'~');
    }
    detail::
    encode_base64_generic<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,jsoncons::stream_sink<char>>
              ((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )local_c8._0_8_,
               (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )local_c8.field_0._0_8_,
               "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789-_",psVar3);
    stream_sink<char>::push_back(psVar3,'\"');
  }
  else {
    if (bVar1 != base64) {
      psVar3 = &this->sink_;
      if (bVar1 == number) {
        stream_sink<char>::append(psVar3,sv->_M_str,sv->_M_len);
        return;
      }
      stream_sink<char>::push_back(psVar3,'\"');
      stream_sink<char>::append(psVar3,sv->_M_str,sv->_M_len);
      stream_sink<char>::push_back(psVar3,'\"');
      return;
    }
    basic_bigint<std::allocator<unsigned_char>_>::from_string<char>(&local_98,sv->_M_str,sv->_M_len)
    ;
    bVar2 = operator<(&local_98,0);
    if (bVar2) {
      basic_bigint<std::allocator<unsigned_char>_>::basic_bigint(&local_40,&local_98);
      local_40.field_0._0_1_ = local_40.field_0._0_1_ ^ 2;
      jsoncons::operator-(&local_c8,&local_40,1);
      basic_bigint<std::allocator<unsigned_char>_>::operator=(&local_98,&local_c8);
      if (((local_c8.field_0._0_8_ & 1) != 0) &&
         ((pointer)local_c8.field_0.short_stor_.values_[1] != (pointer)0x0)) {
        operator_delete(local_c8.field_0.dynamic_stor_.data_,
                        local_c8.field_0.short_stor_.values_[0] << 3);
      }
      if (((local_40.field_0._0_1_ & 1) != 0) &&
         ((pointer)local_40.field_0.short_stor_.values_[1] != (pointer)0x0)) {
        operator_delete(local_40.field_0.dynamic_stor_.data_,
                        local_40.field_0.short_stor_.values_[0] << 3);
      }
    }
    local_c8._0_8_ = (uchar *)0x0;
    local_c8.field_0._0_8_ = (uchar *)0x0;
    local_c8.field_0.common_stor_.length_ = 0;
    basic_bigint<std::allocator<unsigned_char>>::write_bytes_be<std::allocator<unsigned_char>>
              ((basic_bigint<std::allocator<unsigned_char>> *)&local_98,&local_6c,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_c8);
    psVar3 = &this->sink_;
    stream_sink<char>::push_back(psVar3,'\"');
    if (bVar2) {
      stream_sink<char>::push_back(psVar3,'~');
    }
    detail::
    encode_base64_generic<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,jsoncons::stream_sink<char>>
              ((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )local_c8._0_8_,
               (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )local_c8.field_0._0_8_,
               "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/=",psVar3);
    stream_sink<char>::push_back(psVar3,'\"');
  }
  if ((uchar *)local_c8._0_8_ != (uchar *)0x0) {
    operator_delete((void *)local_c8._0_8_,local_c8.field_0.common_stor_.length_ - local_c8._0_8_);
  }
  if (((local_98.field_0._0_1_ & 1) != 0) &&
     ((pointer)local_98.field_0.short_stor_.values_[1] != (pointer)0x0)) {
    operator_delete(local_98.field_0.dynamic_stor_.data_,
                    local_98.field_0.short_stor_.values_[0] << 3);
  }
  return;
}

Assistant:

void write_bigint_value(const string_view_type& sv)
        {
            switch (options_.bignum_format())
            {
                case bignum_format_kind::raw:
                {
                    sink_.append(sv.data(),sv.size());
                    break;
                }
                case bignum_format_kind::base64:
                {
                    bigint n = bigint::from_string(sv.data(), sv.length());
                    bool is_neg = n < 0;
                    if (is_neg)
                    {
                        n = - n -1;
                    }
                    int signum;
                    std::vector<uint8_t> v;
                    n.write_bytes_be(signum, v);

                    sink_.push_back('\"');
                    if (is_neg)
                    {
                        sink_.push_back('~');
                    }
                    encode_base64(v.begin(), v.end(), sink_);
                    sink_.push_back('\"');
                    break;
                }
                case bignum_format_kind::base64url:
                {
                    bigint n = bigint::from_string(sv.data(), sv.length());
                    bool is_neg = n < 0;
                    if (is_neg)
                    {
                        n = - n -1;
                    }
                    int signum;
                    std::vector<uint8_t> v;
                    n.write_bytes_be(signum, v);

                    sink_.push_back('\"');
                    if (is_neg)
                    {
                        sink_.push_back('~');
                    }
                    encode_base64url(v.begin(), v.end(), sink_);
                    sink_.push_back('\"');
                    break;
                }
                default:
                {
                    sink_.push_back('\"');
                    sink_.append(sv.data(),sv.size());
                    sink_.push_back('\"');
                    break;
                }
            }
        }